

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.c++
# Opt level: O2

void __thiscall kj::Exception::Context::Context(Context *this,Context *other)

{
  Context *orig;
  String *in_RDX;
  Disposer *local_38;
  Context *pCStack_30;
  Own<kj::Exception::Context,_std::nullptr_t> local_28;
  
  this->file = other->file;
  this->line = other->line;
  str<kj::String_const&>(&this->description,(kj *)&other->description,in_RDX);
  (this->next).ptr.disposer = (Disposer *)0x0;
  (this->next).ptr.ptr = (Context *)0x0;
  orig = (other->next).ptr.ptr;
  if (orig != (Context *)0x0) {
    heap<kj::Exception::Context_const&>((kj *)&local_38,orig);
    local_28.disposer = local_38;
    local_28.ptr = pCStack_30;
    pCStack_30 = (Context *)0x0;
    Own<kj::Exception::Context,_std::nullptr_t>::operator=(&(this->next).ptr,&local_28);
    if (local_28.ptr != (Context *)0x0) {
      local_28.ptr = (Context *)0x0;
      (*(code *)**(undefined8 **)local_28.disposer)();
    }
    if (pCStack_30 != (Context *)0x0) {
      pCStack_30 = (Context *)0x0;
      (*(code *)**(undefined8 **)local_38)();
    }
  }
  return;
}

Assistant:

Exception::Context::Context(const Context& other) noexcept
    : file(other.file), line(other.line), description(str(other.description)) {
  KJ_IF_SOME(n, other.next) {
    next = heap(*n);
  }
}